

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O3

void oonf_cfg_cleanup(void)

{
  free(config_global.plugin.value);
  config_global.plugin = (strarray)ZEXT816(0);
  free(config_global.pidfile);
  free(config_global.lockfile);
  free(config_global.plugin_path);
  cfg_db_remove(_oonf_raw_db);
  cfg_db_remove(_oonf_work_db);
  cfg_remove(&_oonf_cfg_instance);
  return;
}

Assistant:

void
oonf_cfg_cleanup(void) {
  strarray_free(&config_global.plugin);
  free(config_global.pidfile);
  free(config_global.lockfile);
  free(config_global.plugin_path);

  cfg_db_remove(_oonf_raw_db);
  cfg_db_remove(_oonf_work_db);

  cfg_remove(&_oonf_cfg_instance);
}